

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void duckdb::StandardBufferManager::BufferAllocatorFree
               (PrivateAllocatorData *private_data,data_ptr_t pointer,idx_t size)

{
  Allocator *this;
  BufferPoolReservation r;
  
  BufferPoolReservation::BufferPoolReservation
            (&r,ALLOCATOR,(BufferPool *)private_data[1]._vptr_PrivateAllocatorData[2]);
  r.size = size;
  BufferPoolReservation::Resize(&r,0);
  this = Allocator::Get((DatabaseInstance *)private_data[1]._vptr_PrivateAllocatorData[1]);
  Allocator::FreeData(this,pointer,size);
  BufferPoolReservation::~BufferPoolReservation(&r);
  return;
}

Assistant:

void StandardBufferManager::BufferAllocatorFree(PrivateAllocatorData *private_data, data_ptr_t pointer, idx_t size) {
	auto &data = private_data->Cast<BufferAllocatorData>();
	BufferPoolReservation r(MemoryTag::ALLOCATOR, data.manager.GetBufferPool());
	r.size = size;
	r.Resize(0);
	return Allocator::Get(data.manager.db).FreeData(pointer, size);
}